

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::PropertySpecSyntax::setChild
          (PropertySpecSyntax *this,size_t index,TokenOrSyntax child)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  TimingControlSyntax *pTVar2;
  PropertyExprSyntax *pPVar3;
  DisableIffSyntax *pDVar4;
  logic_error *this_00;
  long *plVar5;
  size_type *psVar6;
  long *plVar7;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (index == 2) {
    ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar1 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pPVar3 = (PropertyExprSyntax *)0x0;
    }
    else {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pPVar3 = SyntaxNode::as<slang::syntax::PropertyExprSyntax>(*ppSVar1);
    }
    if (pPVar3 == (PropertyExprSyntax *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x1b,
                 "slang::not_null<slang::syntax::PropertyExprSyntax *>::not_null(U &&) [T = slang::syntax::PropertyExprSyntax *, U = slang::syntax::PropertyExprSyntax *]"
                );
    }
    (this->expr).ptr = pPVar3;
  }
  else if (index == 1) {
    ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar1 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pDVar4 = (DisableIffSyntax *)0x0;
    }
    else {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pDVar4 = (DisableIffSyntax *)*ppSVar1;
      if ((pDVar4->super_SyntaxNode).kind != DisableIff) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,"T &slang::syntax::SyntaxNode::as() [T = slang::syntax::DisableIffSyntax]")
        ;
      }
    }
    this->disable = pDVar4;
  }
  else {
    if (index != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O1/extern/slang/source/AllSyntax.cpp"
                 ,"");
      plVar5 = (long *)std::__cxx11::string::append((char *)local_90);
      local_d0._M_dataplus._M_p = (pointer)*plVar5;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar6) {
        local_d0.field_2._M_allocated_capacity = *psVar6;
        local_d0.field_2._8_8_ = plVar5[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar6;
      }
      local_d0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x29ef);
      std::operator+(&local_50,&local_d0,&local_70);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_b0 = (long *)*plVar5;
      plVar7 = plVar5 + 2;
      if (local_b0 == plVar7) {
        local_a0 = *plVar7;
        lStack_98 = plVar5[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar7;
      }
      local_a8 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_f0 = (long *)*plVar5;
      plVar7 = plVar5 + 2;
      if (local_f0 == plVar7) {
        local_e0 = *plVar7;
        lStack_d8 = plVar5[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar7;
      }
      local_e8 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_f0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar1 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pTVar2 = (TimingControlSyntax *)0x0;
    }
    else {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pTVar2 = SyntaxNode::as<slang::syntax::TimingControlSyntax>(*ppSVar1);
    }
    this->clocking = pTVar2;
  }
  return;
}

Assistant:

void PropertySpecSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: clocking = child.node() ? &child.node()->as<TimingControlSyntax>() : nullptr; return;
        case 1: disable = child.node() ? &child.node()->as<DisableIffSyntax>() : nullptr; return;
        case 2: expr = child.node() ? &child.node()->as<PropertyExprSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}